

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void INT_CMCondition_signal(CManager cm,int condition)

{
  int iVar1;
  CMCondition p_Var2;
  CManager in_RDI;
  CMControlList cl;
  CMCondition cond;
  CMCondition in_stack_ffffffffffffffd8;
  CManager cm_00;
  CMControlList in_stack_ffffffffffffffe8;
  
  cm_00 = (CManager)in_RDI->control_list;
  iVar1 = CManager_locked(in_RDI);
  if (iVar1 == 0) {
    printf("Not LOCKED!\n");
  }
  set_debug_flag((CManager)0x12a322);
  p_Var2 = CMCondition_find(in_stack_ffffffffffffffe8,(int)((ulong)cm_00 >> 0x20));
  if (p_Var2 != (CMCondition)0x0) {
    p_Var2->signaled = 1;
    CMCondition_trigger(cm_00,in_stack_ffffffffffffffd8,(CMControlList)0x12a35f);
    if (*(int *)&cm_00->cm_buffer_list == 0) {
      in_RDI->abort_read_ahead = 1;
    }
    if (*(int *)((long)&cm_00->cm_buffer_list + 4) != 0) {
      CMwake_server_thread(cm_00);
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_signal(CManager cm, int condition)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    if(!CManager_locked(cm)) {
	printf("Not LOCKED!\n");
    }
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->signaled = 1;
    CMCondition_trigger(cm, cond, cl);
    if (cl->has_thread == 0) cm->abort_read_ahead = 1;
    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}